

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGeneratorMocUic::ParallelJobPushUic(cmQtAutoGeneratorMocUic *this,JobHandleT *jobHandle)

{
  JobT *pJVar1;
  _Elt_pointer puVar2;
  JobT *pJVar3;
  __type _Var4;
  bool bVar5;
  _Elt_pointer puVar6;
  _Elt_pointer puVar7;
  pthread_mutex_t *__mutex;
  string sStack_98;
  pthread_mutex_t *local_78;
  string error;
  _Map_pointer local_48;
  
  __mutex = (pthread_mutex_t *)&this->JobsMutex_;
  std::mutex::lock((mutex *)&__mutex->__data);
  if (this->JobThreadsAbort_ == false) {
    pJVar1 = (jobHandle->_M_t).
             super___uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
             .super__Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false>._M_head_impl;
    puVar6 = (this->JobQueues_).Uic.
             super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    puVar7 = (this->JobQueues_).Uic.
             super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_48 = (this->JobQueues_).Uic.
               super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    puVar2 = (this->JobQueues_).Uic.
             super__Deque_base<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_78 = __mutex;
    while (__mutex = local_78, puVar6 != puVar2) {
      pJVar3 = (puVar6->_M_t).
               super___uniq_ptr_impl<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
               .super__Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false>._M_head_impl;
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (pJVar3 + 9),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (pJVar1 + 9));
      if (_Var4) {
        bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(pJVar3 + 1),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(pJVar1 + 1));
        __mutex = local_78;
        if (bVar5) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&error,"The two source files\n  ",(allocator<char> *)&sStack_98);
          cmQtAutoGen::Quoted(&sStack_98,(string *)(pJVar1 + 5));
          std::__cxx11::string::append((string *)&error);
          std::__cxx11::string::~string((string *)&sStack_98);
          std::__cxx11::string::append((char *)&error);
          cmQtAutoGen::Quoted(&sStack_98,(string *)(pJVar3 + 5));
          std::__cxx11::string::append((string *)&error);
          std::__cxx11::string::~string((string *)&sStack_98);
          std::__cxx11::string::append((char *)&error);
          cmQtAutoGen::Quoted(&sStack_98,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (pJVar1 + 9));
          std::__cxx11::string::append((string *)&error);
          std::__cxx11::string::~string((string *)&sStack_98);
          std::__cxx11::string::append((char *)&error);
          cmQtAutoGen::Quoted(&sStack_98,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (pJVar1 + 1));
          std::__cxx11::string::append((string *)&error);
          std::__cxx11::string::~string((string *)&sStack_98);
          std::__cxx11::string::append((char *)&error);
          cmQtAutoGen::Quoted(&sStack_98,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (pJVar3 + 1));
          std::__cxx11::string::append((string *)&error);
          std::__cxx11::string::~string((string *)&sStack_98);
          std::__cxx11::string::append((char *)&error);
          cmQtAutoGenerator::Logger::Error(&(this->super_cmQtAutoGenerator).Logger_,UIC,&error);
          RegisterJobError(this);
          std::__cxx11::string::~string((string *)&error);
        }
        goto LAB_0017f330;
      }
      puVar6 = puVar6 + 1;
      if (puVar6 == puVar7) {
        puVar6 = local_48[1];
        local_48 = local_48 + 1;
        puVar7 = puVar6 + 0x40;
      }
    }
    std::
    deque<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>,std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>>>
    ::
    emplace_back<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>>
              ((deque<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>,std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>>>
                *)&(this->JobQueues_).Uic,jobHandle);
  }
LAB_0017f330:
  bVar5 = this->JobError_;
  pthread_mutex_unlock(__mutex);
  return (bool)(bVar5 ^ 1);
}

Assistant:

bool cmQtAutoGeneratorMocUic::ParallelJobPushUic(JobHandleT& jobHandle)
{
  std::lock_guard<std::mutex> jobsLock(JobsMutex_);
  if (!JobThreadsAbort_) {
    bool pushJobHandle = true;
    // Look for include collisions.
    const JobUicT& uicJob(static_cast<JobUicT&>(*jobHandle));
    for (const JobHandleT& otherHandle : JobQueues_.Uic) {
      const JobUicT& otherJob(static_cast<JobUicT&>(*otherHandle));
      if (otherJob.IncludeString == uicJob.IncludeString) {
        // Check if the same uic file would be generated from different
        // source files which would be an error.
        if (otherJob.SourceFile != uicJob.SourceFile) {
          // Include string collision
          std::string error = "The two source files\n  ";
          error += Quoted(uicJob.IncluderFile);
          error += " and\n  ";
          error += Quoted(otherJob.IncluderFile);
          error += "\ncontain the same uic include string ";
          error += Quoted(uicJob.IncludeString);
          error += "\nbut the uic file would be generated from different "
                   "source files\n  ";
          error += Quoted(uicJob.SourceFile);
          error += " and\n  ";
          error += Quoted(otherJob.SourceFile);
          error +=
            ".\nConsider to\n"
            "- add a directory prefix to a \"ui_<NAME>.h\" include "
            "(e.g \"sub/ui_<NAME>.h\")\n"
            "- rename the <NAME>.ui file(s) and adjust the \"ui_<NAME>.h\" "
            "include(s)\n";
          Log().Error(GenT::UIC, error);
          RegisterJobError();
        }
        // Do not push this job in since the uic file already
        // gets generated by an other job.
        pushJobHandle = false;
        break;
      }
    }
    if (pushJobHandle) {
      JobQueues_.Uic.emplace_back(std::move(jobHandle));
    }
  }
  return !JobError_;
}